

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_math_round(jit_State *J,RecordFFData *rd)

{
  undefined4 uVar1;
  TRef TVar2;
  long in_RSI;
  jit_State *in_RDI;
  TRef tr;
  TRef in_stack_ffffffffffffffcc;
  jit_State *pjVar3;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar4;
  
  uVar4 = *in_RDI->base;
  if (4 < (uVar4 >> 0x18 & 0x1f) - 0xf) {
    pjVar3 = in_RDI;
    TVar2 = lj_ir_tonum(in_RDI,in_stack_ffffffffffffffcc);
    uVar1 = *(undefined4 *)(in_RSI + 0x10);
    (pjVar3->fold).ins.field_0.ot = 0x340e;
    (pjVar3->fold).ins.field_0.op1 = (IRRef1)TVar2;
    (pjVar3->fold).ins.field_0.op2 = (IRRef1)uVar1;
    TVar2 = lj_opt_fold((jit_State *)CONCAT44(uVar4,in_stack_ffffffffffffffd8));
    *in_RDI->base = TVar2;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_math_round(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  if (!tref_isinteger(tr)) {  /* Pass through integers unmodified. */
    tr = emitir(IRTN(IR_FPMATH), lj_ir_tonum(J, tr), rd->data);
    /* Result is integral (or NaN/Inf), but may not fit an int32_t. */
    if (LJ_DUALNUM) {  /* Try to narrow using a guarded conversion to int. */
      lua_Number n = lj_vm_foldfpm(numberVnum(&rd->argv[0]), rd->data);
      if (n == (lua_Number)lj_num2int(n))
	tr = emitir(IRTGI(IR_CONV), tr, IRCONV_INT_NUM|IRCONV_CHECK);
    }
    J->base[0] = tr;
  }
}